

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

void Abc_ManTimeExpand(Abc_ManTime_t *p,int nSize,int fProgressive)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  size_t sVar5;
  ulong uVar6;
  size_t __size;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  pVVar2 = p->vArrs;
  iVar1 = pVVar2->nSize;
  uVar9 = (ulong)iVar1;
  if (iVar1 < nSize) {
    uVar8 = nSize << (fProgressive != 0);
    uVar7 = 100;
    if (100 < (int)uVar8) {
      uVar7 = uVar8;
    }
    if (pVVar2->nCap < (int)uVar7) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar7 << 3);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar2->pArray,(ulong)uVar7 << 3);
      }
      pVVar2->pArray = ppvVar3;
      pVVar2->nCap = uVar7;
    }
    pVVar2->nSize = uVar7;
    if ((iVar1 == 0) || (*pVVar2->pArray == (void *)0x0)) {
      pvVar4 = malloc((ulong)uVar7 * 8);
    }
    else {
      pvVar4 = realloc(*pVVar2->pArray,(ulong)uVar7 * 8);
    }
    __size = (ulong)uVar7 * 8;
    sVar5 = 0;
    do {
      *(size_t *)((long)pVVar2->pArray + sVar5) = (long)pvVar4 + sVar5;
      sVar5 = sVar5 + 8;
    } while (__size != sVar5);
    if (iVar1 < (int)uVar7) {
      ppvVar3 = pVVar2->pArray;
      uVar6 = uVar9;
      do {
        *(undefined8 *)ppvVar3[uVar6] = 0xce6e6b28ce6e6b28;
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    pVVar2 = p->vReqs;
    if (pVVar2->nCap < (int)uVar7) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(__size);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar2->pArray,__size);
      }
      pVVar2->pArray = ppvVar3;
      pVVar2->nCap = uVar7;
    }
    pVVar2->nSize = uVar7;
    if ((iVar1 == 0) || (*pVVar2->pArray == (void *)0x0)) {
      pvVar4 = malloc(__size);
    }
    else {
      pvVar4 = realloc(*pVVar2->pArray,__size);
    }
    sVar5 = 0;
    do {
      *(size_t *)((long)pVVar2->pArray + sVar5) = (long)pvVar4 + sVar5;
      sVar5 = sVar5 + 8;
    } while (__size != sVar5);
    if (iVar1 < (int)uVar7) {
      do {
        builtin_strncpy((char *)pVVar2->pArray[uVar9],"(knN(knN",8);
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
  }
  return;
}

Assistant:

void Abc_ManTimeExpand( Abc_ManTime_t * p, int nSize, int fProgressive )
{
    Vec_Ptr_t * vTimes;
    Abc_Time_t * ppTimes, * ppTimesOld, * pTime;
    int nSizeOld, nSizeNew, i;

    nSizeOld = p->vArrs->nSize;
    if ( nSizeOld >= nSize )
        return;
    nSizeNew = fProgressive? 2 * nSize : nSize;
    if ( nSizeNew < 100 )
        nSizeNew = 100;

    vTimes = p->vArrs;
    Vec_PtrGrow( vTimes, nSizeNew );
    vTimes->nSize = nSizeNew;
    ppTimesOld = ( nSizeOld == 0 )? NULL : (Abc_Time_t *)vTimes->pArray[0];
    ppTimes = ABC_REALLOC( Abc_Time_t, ppTimesOld, nSizeNew );
    for ( i = 0; i < nSizeNew; i++ )
        vTimes->pArray[i] = ppTimes + i;
    for ( i = nSizeOld; i < nSizeNew; i++ )
    {
        pTime = (Abc_Time_t *)vTimes->pArray[i];
        pTime->Rise  = -ABC_INFINITY;
        pTime->Fall  = -ABC_INFINITY;
    }

    vTimes = p->vReqs;
    Vec_PtrGrow( vTimes, nSizeNew );
    vTimes->nSize = nSizeNew;
    ppTimesOld = ( nSizeOld == 0 )? NULL : (Abc_Time_t *)vTimes->pArray[0];
    ppTimes = ABC_REALLOC( Abc_Time_t, ppTimesOld, nSizeNew );
    for ( i = 0; i < nSizeNew; i++ )
        vTimes->pArray[i] = ppTimes + i;
    for ( i = nSizeOld; i < nSizeNew; i++ )
    {
        pTime = (Abc_Time_t *)vTimes->pArray[i];
        pTime->Rise  = ABC_INFINITY;
        pTime->Fall  = ABC_INFINITY;
    }
}